

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

CompilationStatus * __thiscall
gl3cts::ClipDistance::Utility::Program::compileShader
          (CompilationStatus *__return_storage_ptr__,Program *this,GLenum shader_type,
          GLchar **shader_code)

{
  GLuint GVar1;
  GLenum GVar2;
  char *__s;
  GLchar *log;
  GLint log_size;
  allocator<char> local_2a;
  undefined1 local_29;
  GLchar **local_28;
  GLchar **shader_code_local;
  Program *pPStack_18;
  GLenum shader_type_local;
  Program *this_local;
  CompilationStatus *shader;
  
  local_29 = 0;
  __return_storage_ptr__->shader_id = 0;
  __return_storage_ptr__->shader_compilation_status = 0;
  local_28 = shader_code;
  shader_code_local._4_4_ = shader_type;
  pPStack_18 = this;
  this_local = (Program *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__return_storage_ptr__->shader_log,"",&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  if (local_28 != (GLchar **)0x0) {
    GVar1 = (*this->m_gl->createShader)(shader_code_local._4_4_);
    __return_storage_ptr__->shader_id = GVar1;
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glCreateShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x500);
    (*this->m_gl->shaderSource)(__return_storage_ptr__->shader_id,1,local_28,(GLint *)0x0);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x505);
    (*this->m_gl->compileShader)(__return_storage_ptr__->shader_id);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x509);
    (*this->m_gl->getShaderiv)
              (__return_storage_ptr__->shader_id,0x8b81,
               &__return_storage_ptr__->shader_compilation_status);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                    ,0x50e);
    if (__return_storage_ptr__->shader_compilation_status == 0) {
      log._0_4_ = 0;
      (*this->m_gl->getShaderiv)(__return_storage_ptr__->shader_id,0x8b84,(GLint *)&log);
      GVar2 = (*this->m_gl->getError)();
      glu::checkError(GVar2,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                      ,0x517);
      if (((int)log != 0) && (__s = (char *)operator_new__((long)(int)log), __s != (char *)0x0)) {
        memset(__s,0,(long)(int)log);
        (*this->m_gl->getShaderInfoLog)
                  (__return_storage_ptr__->shader_id,(int)log,(GLsizei *)0x0,__s);
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->shader_log,__s);
        if (__s != (char *)0x0) {
          operator_delete__(__s);
        }
        GVar2 = (*this->m_gl->getError)();
        glu::checkError(GVar2,"glGetShaderInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.cpp"
                        ,0x527);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::CompilationStatus gl3cts::ClipDistance::Utility::Program::compileShader(
	const glw::GLenum shader_type, const glw::GLchar* const* shader_code)
{
	CompilationStatus shader = { 0, GL_NONE, "" };

	if (shader_code != DE_NULL)
	{
		try
		{
			/* Creation */
			shader.shader_id = m_gl.createShader(shader_type);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateShader() call failed.");

			/* Compilation */
			m_gl.shaderSource(shader.shader_id, 1, shader_code, NULL);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glShaderSource() call failed.");

			m_gl.compileShader(shader.shader_id);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCompileShader() call failed.");

			/* Status */
			m_gl.getShaderiv(shader.shader_id, GL_COMPILE_STATUS, &shader.shader_compilation_status);

			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv() call failed.");

			/* Logging */
			if (shader.shader_compilation_status == GL_FALSE)
			{
				glw::GLint log_size = 0;

				m_gl.getShaderiv(shader.shader_id, GL_INFO_LOG_LENGTH, &log_size);

				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderiv() call failed.");

				if (log_size)
				{
					glw::GLchar* log = new glw::GLchar[log_size];

					if (log)
					{
						memset(log, 0, log_size);

						m_gl.getShaderInfoLog(shader.shader_id, log_size, DE_NULL, log);

						shader.shader_log = log;

						delete[] log;

						GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetShaderInfoLog() call failed.");
					}
				}
			}
		}
		catch (...)
		{
			if (shader.shader_id)
			{
				m_gl.deleteShader(shader.shader_id);

				shader.shader_id = 0;
			}
		}
	}

	return shader;
}